

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int ecp_add_mixed(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,
                 mbedtls_ecp_point *Q)

{
  mbedtls_mpi *X_00;
  mbedtls_mpi *Y_00;
  int iVar1;
  mbedtls_ecp_point *Q_00;
  mbedtls_mpi T1;
  mbedtls_mpi T3;
  mbedtls_mpi X;
  mbedtls_mpi T2;
  mbedtls_mpi T4;
  mbedtls_mpi Y;
  mbedtls_mpi Z;
  
  add_count = add_count + 1;
  X_00 = &P->Z;
  iVar1 = mbedtls_mpi_cmp_int(X_00,0);
  Q_00 = Q;
  if (iVar1 == 0) {
LAB_0012f7c8:
    iVar1 = mbedtls_ecp_copy(R,Q_00);
    return iVar1;
  }
  if ((Q->Z).p != (mbedtls_mpi_uint *)0x0) {
    iVar1 = mbedtls_mpi_cmp_int(&Q->Z,0);
    Q_00 = P;
    if (iVar1 == 0) goto LAB_0012f7c8;
    if (((Q->Z).p != (mbedtls_mpi_uint *)0x0) && (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,1), iVar1 != 0))
    {
      return -0x4f80;
    }
  }
  mbedtls_mpi_init(&T1);
  mbedtls_mpi_init(&T2);
  mbedtls_mpi_init(&T3);
  mbedtls_mpi_init(&T4);
  mbedtls_mpi_init(&X);
  mbedtls_mpi_init(&Y);
  mbedtls_mpi_init(&Z);
  iVar1 = mbedtls_mpi_mul_mpi(&T1,X_00,X_00);
  if ((iVar1 == 0) && (iVar1 = ecp_modp(&T1,grp), iVar1 == 0)) {
    mul_count = mul_count + 1;
    iVar1 = mbedtls_mpi_mul_mpi(&T2,&T1,X_00);
    if ((iVar1 == 0) && (iVar1 = ecp_modp(&T2,grp), iVar1 == 0)) {
      mul_count = mul_count + 1;
      iVar1 = mbedtls_mpi_mul_mpi(&T1,&T1,&Q->X);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&T1,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_mul_mpi(&T2,&T2,&Q->Y);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&T2,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_sub_mpi(&T1,&T1,&P->X);
          if (iVar1 == 0) {
            Y_00 = &grp->P;
            do {
              if ((-1 < T1.s) || (iVar1 = mbedtls_mpi_cmp_int(&T1,0), iVar1 == 0)) {
                iVar1 = mbedtls_mpi_sub_mpi(&T2,&T2,&P->Y);
                if (iVar1 == 0) {
                  goto LAB_0012f863;
                }
                break;
              }
              iVar1 = mbedtls_mpi_add_mpi(&T1,&T1,Y_00);
            } while (iVar1 == 0);
          }
        }
      }
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_add_mpi(&T2,&T2,Y_00), iVar1 == 0) {
LAB_0012f863:
    if ((-1 < T2.s) || (iVar1 = mbedtls_mpi_cmp_int(&T2,0), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_cmp_int(&T1,0);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_cmp_int(&T2,0);
        if (iVar1 == 0) {
          iVar1 = ecp_double_jac(grp,R,P);
        }
        else {
          iVar1 = mbedtls_ecp_set_zero(R);
        }
      }
      else {
        iVar1 = mbedtls_mpi_mul_mpi(&Z,X_00,&T1);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&Z,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_mul_mpi(&T3,&T1,&T1);
          if ((iVar1 == 0) && (iVar1 = ecp_modp(&T3,grp), iVar1 == 0)) {
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_mul_mpi(&T4,&T3,&T1);
            if ((iVar1 == 0) && (iVar1 = ecp_modp(&T4,grp), iVar1 == 0)) {
              mul_count = mul_count + 1;
              iVar1 = mbedtls_mpi_mul_mpi(&T3,&T3,&P->X);
              if ((iVar1 == 0) && (iVar1 = ecp_modp(&T3,grp), iVar1 == 0)) {
                mul_count = mul_count + 1;
                iVar1 = mbedtls_mpi_mul_int(&T1,&T3,2);
                if (iVar1 == 0) {
                  goto LAB_0012f9a3;
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_sub_abs(&T1,&T1,Y_00), iVar1 == 0) {
LAB_0012f9a3:
    iVar1 = mbedtls_mpi_cmp_mpi(&T1,Y_00);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_mul_mpi(&X,&T2,&T2);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&X,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_sub_mpi(&X,&X,&T1);
        if (iVar1 == 0) {
          goto LAB_0012fa52;
        }
      }
      break;
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_add_mpi(&X,&X,Y_00), iVar1 == 0) {
LAB_0012fa52:
    if ((-1 < X.s) || (iVar1 = mbedtls_mpi_cmp_int(&X,0), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_sub_mpi(&X,&X,&T4);
      if (iVar1 == 0) {
        goto LAB_0012faa0;
      }
      break;
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_add_mpi(&X,&X,Y_00), iVar1 == 0) {
LAB_0012faa0:
    if ((-1 < X.s) || (iVar1 = mbedtls_mpi_cmp_int(&X,0), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_sub_mpi(&T3,&T3,&X);
      if (iVar1 == 0) {
        goto LAB_0012faee;
      }
      break;
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_add_mpi(&T3,&T3,Y_00), iVar1 == 0) {
LAB_0012faee:
    if ((-1 < T3.s) || (iVar1 = mbedtls_mpi_cmp_int(&T3,0), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_mul_mpi(&T3,&T3,&T2);
      if ((iVar1 == 0) && (iVar1 = ecp_modp(&T3,grp), iVar1 == 0)) {
        mul_count = mul_count + 1;
        iVar1 = mbedtls_mpi_mul_mpi(&T4,&T4,&P->Y);
        if ((iVar1 == 0) && (iVar1 = ecp_modp(&T4,grp), iVar1 == 0)) {
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_sub_mpi(&Y,&T3,&T4);
          if (iVar1 == 0) {
            goto LAB_0012fbb3;
          }
        }
      }
      break;
    }
  }
  goto LAB_0012f7fe;
  while (iVar1 = mbedtls_mpi_add_mpi(&Y,&Y,Y_00), iVar1 == 0) {
LAB_0012fbb3:
    if ((-1 < Y.s) || (iVar1 = mbedtls_mpi_cmp_int(&Y,0), iVar1 == 0)) {
      iVar1 = mbedtls_mpi_copy(&R->X,&X);
      if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&R->Y,&Y), iVar1 == 0)) {
        iVar1 = mbedtls_mpi_copy(&R->Z,&Z);
      }
      break;
    }
  }
LAB_0012f7fe:
  mbedtls_mpi_free(&T1);
  mbedtls_mpi_free(&T2);
  mbedtls_mpi_free(&T3);
  mbedtls_mpi_free(&T4);
  mbedtls_mpi_free(&X);
  mbedtls_mpi_free(&Y);
  mbedtls_mpi_free(&Z);
  return iVar1;
}

Assistant:

static int ecp_add_mixed( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q )
{
    int ret;
    mbedtls_mpi T1, T2, T3, T4, X, Y, Z;

#if defined(MBEDTLS_SELF_TEST)
    add_count++;
#endif

    /*
     * Trivial cases: P == 0 or Q == 0 (case 1)
     */
    if( mbedtls_mpi_cmp_int( &P->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, Q ) );

    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, P ) );

    /*
     * Make sure Q coordinates are normalized
     */
    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 ); mbedtls_mpi_init( &T3 ); mbedtls_mpi_init( &T4 );
    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1,  &P->Z,  &P->Z ) );  MOD_MUL( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T2,  &T1,    &P->Z ) );  MOD_MUL( T2 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T1,  &T1,    &Q->X ) );  MOD_MUL( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T2,  &T2,    &Q->Y ) );  MOD_MUL( T2 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T1,  &T1,    &P->X ) );  MOD_SUB( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T2,  &T2,    &P->Y ) );  MOD_SUB( T2 );

    /* Special cases (2) and (3) */
    if( mbedtls_mpi_cmp_int( &T1, 0 ) == 0 )
    {
        if( mbedtls_mpi_cmp_int( &T2, 0 ) == 0 )
        {
            ret = ecp_double_jac( grp, R, P );
            goto cleanup;
        }
        else
        {
            ret = mbedtls_ecp_set_zero( R );
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &Z,   &P->Z,  &T1   ) );  MOD_MUL( Z  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T1,    &T1   ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T4,  &T3,    &T1   ) );  MOD_MUL( T4 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T3,    &P->X ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1,  &T3,    2     ) );  MOD_ADD( T1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &X,   &T2,    &T2   ) );  MOD_MUL( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X,   &X,     &T1   ) );  MOD_SUB( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X,   &X,     &T4   ) );  MOD_SUB( X  );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &T3,  &T3,    &X    ) );  MOD_SUB( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T3,  &T3,    &T2   ) );  MOD_MUL( T3 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T4,  &T4,    &P->Y ) );  MOD_MUL( T4 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &Y,   &T3,    &T4   ) );  MOD_SUB( Y  );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &Z ) );

cleanup:

    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 ); mbedtls_mpi_free( &T3 ); mbedtls_mpi_free( &T4 );
    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );

    return( ret );
}